

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void append_suite::append_unsigned_int_with_boolean(void)

{
  undefined4 local_a4;
  type_conflict5 local_a0;
  undefined1 local_9b;
  undefined1 local_9a [2];
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_4b;
  undefined1 local_4a [2];
  undefined1 local_48 [8];
  variable data;
  uint input;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            ((basic_variable<std::allocator<char>_> *)local_48,2);
  local_4a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_4b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x2c4,"void append_suite::append_unsigned_int_with_boolean()",local_4a,&local_4b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_98,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_48,&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  local_9a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_9b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x2c6,"void append_suite::append_unsigned_int_with_boolean()",local_9a,&local_9b);
  local_a0 = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_int>
                       ((basic_variable<std::allocator<char>_> *)local_48);
  local_a4 = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,unsigned_int>
            ("data.value<unsigned int>()","3U",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x2c7,"void append_suite::append_unsigned_int_with_boolean()",&local_a0,&local_a4);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  return;
}

Assistant:

void append_unsigned_int_with_boolean()
{
    unsigned int input = 2U;
    variable data(input);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
    data += variable(true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<unsigned int>(), 3U);
}